

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcObjectDefinition::~IfcObjectDefinition(IfcObjectDefinition *this)

{
  ~IfcObjectDefinition
            ((IfcObjectDefinition *)
             ((long)&(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                     ._vptr_ObjectHelper +
             (long)(this->super_IfcRoot).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcObjectDefinition() : Object("IfcObjectDefinition") {}